

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall Matrix::FromArray(Matrix *this,double *data,int rows,int cols)

{
  double *__dest;
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  ulong uVar3;
  Matrix MVar4;
  
  this->data = (double *)0x0;
  this->rows = rows;
  this->cols = cols;
  iVar1 = cols * rows;
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar3 = (long)iVar1 * 8;
  }
  __dest = (double *)operator_new__(uVar3);
  this->data = __dest;
  uVar2 = extraout_RDX;
  if (iVar1 != 0) {
    memcpy(__dest,data,(long)iVar1 * 8);
    uVar2 = extraout_RDX_00;
  }
  MVar4.rows = (int)uVar2;
  MVar4.cols = (int)((ulong)uVar2 >> 0x20);
  MVar4.data = (double *)this;
  return MVar4;
}

Assistant:

Matrix Matrix::FromArray(double* data, int rows, int cols)
{
    Matrix matrix(rows, cols);
    std::copy(data, data + rows * cols, matrix.data);

    return matrix;
}